

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result spvc_compiler_compile(spvc_compiler compiler,char **source)

{
  spvc_context_s *psVar1;
  char *pcVar2;
  spvc_result sVar3;
  allocator local_a1;
  string result;
  string local_60;
  string local_40;
  
  (*((compiler->compiler)._M_t.
     super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>._M_t.
     super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>.
     super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl)->_vptr_Compiler[2])
            (&result);
  psVar1 = compiler->context;
  if (result._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_40,"Unsupported SPIR-V.",&local_a1);
    spvc_context_s::report_error(psVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    sVar3 = SPVC_ERROR_UNSUPPORTED_SPIRV;
  }
  else {
    pcVar2 = spvc_context_s::allocate_name(psVar1,&result);
    *source = pcVar2;
    sVar3 = SPVC_SUCCESS;
    if (pcVar2 == (char *)0x0) {
      psVar1 = compiler->context;
      std::__cxx11::string::string((string *)&local_60,"Out of memory.",&local_a1);
      spvc_context_s::report_error(psVar1,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      sVar3 = SPVC_ERROR_OUT_OF_MEMORY;
    }
  }
  std::__cxx11::string::~string((string *)&result);
  return sVar3;
}

Assistant:

spvc_result spvc_compiler_compile(spvc_compiler compiler, const char **source)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto result = compiler->compiler->compile();
		if (result.empty())
		{
			compiler->context->report_error("Unsupported SPIR-V.");
			return SPVC_ERROR_UNSUPPORTED_SPIRV;
		}

		*source = compiler->context->allocate_name(result);
		if (!*source)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}
		return SPVC_SUCCESS;
	}